

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall crnlib::dynamic_string::compare(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  char *pcVar2;
  code *local_38;
  int result;
  bool case_sensitive_local;
  char *p_local;
  dynamic_string *this_local;
  
  if (case_sensitive) {
    local_38 = strcmp;
  }
  else {
    local_38 = crn_stricmp;
  }
  pcVar2 = get_ptr_priv(this);
  iVar1 = (*local_38)(pcVar2,p);
  if (iVar1 < 0) {
    this_local._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int dynamic_string::compare(const char* p, bool case_sensitive) const
    {
        CRNLIB_ASSERT(p);

        const int result = (case_sensitive ? strcmp : crn_stricmp)(get_ptr_priv(), p);

        if (result < 0)
        {
            return -1;
        }
        else if (result > 0)
        {
            return 1;
        }

        return 0;
    }